

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  int i_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  int j;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_b60 [32];
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined1 local_ac0 [32];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  int local_a04;
  undefined1 (*local_940) [32];
  int local_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  int local_8e4;
  undefined1 (*local_860) [32];
  int local_858;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  int local_7b8;
  undefined1 (*local_7b0) [32];
  undefined1 (*local_7a8) [32];
  undefined1 (*local_7a0) [32];
  
  iVar15 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar12 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar13 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar15 == 1) {
    local_7a0 = (undefined1 (*) [32])*in_RSI;
    local_7a8 = *(undefined1 (**) [32])((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
    local_7b0 = *(undefined1 (**) [32])((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240);
    iVar14 = iVar3 * iVar5;
    for (local_7b8 = 0; local_7b8 + 7 < iVar14; local_7b8 = local_7b8 + 8) {
      auVar6 = vfmadd213ps_fma(*local_7b0,*local_7a0,*local_7a8);
      local_7e0 = auVar6._0_8_;
      uStack_7d8 = auVar6._8_8_;
      *(undefined8 *)*local_7a0 = local_7e0;
      *(undefined8 *)(*local_7a0 + 8) = uStack_7d8;
      *(undefined8 *)(*local_7a0 + 0x10) = 0;
      *(undefined8 *)(*local_7a0 + 0x18) = 0;
      local_7a0 = local_7a0 + 1;
      local_7a8 = local_7a8 + 1;
      local_7b0 = local_7b0 + 1;
    }
    for (; local_7b8 + 3 < iVar14; local_7b8 = local_7b8 + 4) {
      auVar6 = vfmadd213ps_fma(*(undefined1 (*) [16])*local_7b0,*(undefined1 (*) [16])*local_7a0,
                               *(undefined1 (*) [16])*local_7a8);
      local_830 = auVar6._0_8_;
      uStack_828 = auVar6._8_8_;
      *(undefined8 *)*local_7a0 = local_830;
      *(undefined8 *)(*local_7a0 + 8) = uStack_828;
      local_7a0 = (undefined1 (*) [32])(*local_7a0 + 0x10);
      local_7a8 = (undefined1 (*) [32])(*local_7a8 + 0x10);
      local_7b0 = (undefined1 (*) [32])(*local_7b0 + 0x10);
    }
    for (; local_7b8 < iVar14; local_7b8 = local_7b8 + 1) {
      *(float *)*local_7a0 = *(float *)*local_7b0 * *(float *)*local_7a0 + *(float *)*local_7a8;
      local_7a0 = (undefined1 (*) [32])(*local_7a0 + 4);
      local_7a8 = (undefined1 (*) [32])(*local_7a8 + 4);
      local_7b0 = (undefined1 (*) [32])(*local_7b0 + 4);
    }
  }
  if (iVar15 == 2) {
    iVar14 = iVar3 * iVar5;
    for (local_858 = 0; local_858 < (int)lVar12; local_858 = local_858 + 1) {
      local_860 = (undefined1 (*) [32])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_858 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_858 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_858 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_858 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_858 << 2) * 4);
        local_a80 = *puVar16;
        uStack_a78 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_a80 = CONCAT44(fVar2,fVar2);
        uStack_a78 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar17 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_858 << 3) * 4);
        local_ac0 = *(undefined1 (*) [32])
                     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                     (long)(local_858 << 3) * 4);
      }
      else {
        auVar17._8_8_ = uVar8;
        auVar17._0_8_ = uVar7;
        auVar17._24_8_ = uVar8;
        auVar17._16_8_ = uVar7;
        local_ac0._8_8_ = uStack_a78;
        local_ac0._0_8_ = local_a80;
        local_ac0._24_8_ = uStack_a78;
        local_ac0._16_8_ = local_a80;
      }
      for (local_8e4 = 0; local_8e4 + 7 < iVar14; local_8e4 = local_8e4 + 8) {
        auVar6 = vfmadd213ps_fma(local_ac0,*local_860,auVar17);
        local_920 = auVar6._0_8_;
        uStack_918 = auVar6._8_8_;
        *(undefined8 *)*local_860 = local_920;
        *(undefined8 *)(*local_860 + 8) = uStack_918;
        *(undefined8 *)(*local_860 + 0x10) = 0;
        *(undefined8 *)(*local_860 + 0x18) = 0;
        local_860 = local_860 + 1;
      }
      for (; local_8e4 + 3 < iVar14; local_8e4 = local_8e4 + 4) {
        auVar9._8_8_ = uStack_a78;
        auVar9._0_8_ = local_a80;
        auVar6._8_8_ = uVar8;
        auVar6._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar9,*(undefined1 (*) [16])*local_860,auVar6);
        local_930 = auVar6._0_8_;
        uStack_928 = auVar6._8_8_;
        *(undefined8 *)*local_860 = local_930;
        *(undefined8 *)(*local_860 + 8) = uStack_928;
        local_860 = (undefined1 (*) [32])(*local_860 + 0x10);
      }
      for (; local_8e4 < iVar14; local_8e4 = local_8e4 + 1) {
        *(float *)*local_860 = fVar2 * *(float *)*local_860 + fVar1;
        local_860 = (undefined1 (*) [32])(*local_860 + 4);
      }
    }
  }
  if ((iVar15 == 3) || (iVar15 == 4)) {
    iVar15 = iVar3 * (int)lVar12 * iVar4 * iVar5;
    for (local_938 = 0; local_938 < (int)lVar13; local_938 = local_938 + 1) {
      local_940 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_938 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_938 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_938 * 4);
      if (iVar5 == 4) {
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_938 << 2) * 4);
        uVar7 = *puVar16;
        uVar8 = puVar16[1];
        puVar16 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_938 << 2) * 4);
        local_b10 = *puVar16;
        uStack_b08 = puVar16[1];
      }
      else {
        uVar7 = CONCAT44(fVar1,fVar1);
        uVar8 = CONCAT44(fVar1,fVar1);
        local_b10 = CONCAT44(fVar2,fVar2);
        uStack_b08 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar18 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_938 << 3) * 4);
        local_b60 = *(undefined1 (*) [32])
                     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                     (long)(local_938 << 3) * 4);
      }
      else {
        auVar18._8_8_ = uVar8;
        auVar18._0_8_ = uVar7;
        auVar18._24_8_ = uVar8;
        auVar18._16_8_ = uVar7;
        local_b60._8_8_ = uStack_b08;
        local_b60._0_8_ = local_b10;
        local_b60._24_8_ = uStack_b08;
        local_b60._16_8_ = local_b10;
      }
      for (local_a04 = 0; local_a04 + 7 < iVar15; local_a04 = local_a04 + 8) {
        auVar6 = vfmadd213ps_fma(local_b60,*local_940,auVar18);
        local_a40 = auVar6._0_8_;
        uStack_a38 = auVar6._8_8_;
        *(undefined8 *)*local_940 = local_a40;
        *(undefined8 *)(*local_940 + 8) = uStack_a38;
        *(undefined8 *)(*local_940 + 0x10) = 0;
        *(undefined8 *)(*local_940 + 0x18) = 0;
        local_940 = local_940 + 1;
      }
      for (; local_a04 + 3 < iVar15; local_a04 = local_a04 + 4) {
        auVar11._8_8_ = uStack_b08;
        auVar11._0_8_ = local_b10;
        auVar10._8_8_ = uVar8;
        auVar10._0_8_ = uVar7;
        auVar6 = vfmadd213ps_fma(auVar11,*(undefined1 (*) [16])*local_940,auVar10);
        local_a50 = auVar6._0_8_;
        uStack_a48 = auVar6._8_8_;
        *(undefined8 *)*local_940 = local_a50;
        *(undefined8 *)(*local_940 + 8) = uStack_a48;
        local_940 = (undefined1 (*) [32])(*local_940 + 0x10);
      }
      for (; local_a04 < iVar15; local_a04 = local_a04 + 1) {
        *(float *)*local_940 = fVar2 * *(float *)*local_940 + fVar1;
        local_940 = (undefined1 (*) [32])(*local_940 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}